

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

void nn_queue_remove(nn_queue *self,nn_queue_item *item)

{
  nn_queue *pnVar1;
  nn_queue *pnVar2;
  nn_queue *pnVar3;
  
  if (item->next != (nn_queue_item *)0xffffffffffffffff) {
    pnVar2 = self;
    pnVar1 = (nn_queue *)0x0;
    do {
      pnVar3 = pnVar1;
      pnVar2 = (nn_queue *)pnVar2->head;
      if (pnVar2 == (nn_queue *)0x0) {
        return;
      }
      pnVar1 = pnVar2;
    } while (pnVar2 != (nn_queue *)item);
    if (self->head == item) {
      self->head = pnVar2->head;
    }
    if (self->tail == item) {
      self->tail = (nn_queue_item *)pnVar3;
    }
    if (pnVar3 != (nn_queue *)0x0) {
      pnVar3->head = pnVar2->head;
    }
    item->next = (nn_queue_item *)0xffffffffffffffff;
  }
  return;
}

Assistant:

void nn_queue_remove (struct nn_queue *self, struct nn_queue_item *item)
{
    struct nn_queue_item *it;
    struct nn_queue_item *prev;

    if (item->next == NN_QUEUE_NOTINQUEUE)
        return;

    prev = NULL;
    for (it = self->head; it != NULL; it = it->next) {
        if (it == item) {
            if (self->head == it)
                self->head = it->next;
            if (self->tail == it)
                self->tail = prev;
            if (prev)
                prev->next = it->next;
            item->next = NN_QUEUE_NOTINQUEUE;
            return;
        }
        prev = it;
    }
}